

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_icdf<trng::uniform01_dist<long_double>>(uniform01_dist<long_double> *d)

{
  long lVar1;
  longdouble lVar2;
  pointer plVar3;
  ulong uVar4;
  int *piVar5;
  pointer plVar6;
  int i;
  int iVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  vector<long_double,_std::allocator<long_double>_> p_values;
  AssertionHandler catchAssertionHandler;
  vector<long_double,_std::allocator<long_double>_> local_138;
  int local_114;
  SourceLineInfo local_110;
  longdouble local_fc;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  ITransientExpression local_c8;
  longdouble *local_b8;
  char *local_b0;
  size_t sStack_a8;
  longdouble *local_a0;
  StringRef local_98;
  longdouble local_88;
  AssertionHandler local_78;
  
  local_e4 = (longdouble)2.7755576e-17;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (longdouble *)0x0;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (longdouble *)0x0;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  local_78.m_assertionInfo.macroName._0_10_ = (BADTYPE)0.5;
  local_d8 = local_e4;
  std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
            (&local_138,(iterator)0x0,(longdouble *)&local_78);
  iVar7 = 2;
  do {
    lVar10 = in_ST4;
    lVar8 = in_ST4;
    local_114 = iVar7;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)0 + in_ST0;
    if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_138,
                 (iterator)
                 local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar8;
    }
    else {
      *local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar8;
    }
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)1 - in_ST1;
    if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_138,
                 (iterator)
                 local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
    }
    else {
      *local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    plVar6 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar3 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = iVar7 + 1;
    in_ST1 = in_ST3;
    in_ST3 = lVar10;
  } while (iVar7 != 0x40);
  if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar3,plVar6);
  }
  plVar3 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_fc = (longdouble)NAN;
    plVar6 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar10 = *plVar6;
      lVar8 = lVar10;
      if (lVar10 < (longdouble)0 || (longdouble)1 < lVar10) {
        piVar5 = __errno_location();
        *piVar5 = 0x21;
        lVar8 = local_fc;
      }
      lVar9 = lVar8;
      if ((longdouble)1 <= lVar8) {
        lVar9 = (longdouble)1;
      }
      lVar2 = (longdouble)0;
      if (lVar8 <= lVar2 || lVar2 != lVar8) {
        lVar9 = lVar2;
      }
      lVar10 = ABS(lVar9 - lVar10);
      if (local_e4 <= lVar10) {
        local_c8._vptr_ITransientExpression = (_func_int **)0x2a8487;
        local_c8.m_isBinaryExpression = true;
        local_c8.m_result = false;
        local_c8._10_6_ = 0;
        local_110.file =
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
        ;
        local_110.line = 0xa8;
        Catch::StringRef::StringRef(&local_98,"std::abs(y - p) < eps");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_c8,&local_110,local_98,Normal);
        local_f0 = local_d8;
        local_88 = lVar10;
        Catch::StringRef::StringRef((StringRef *)&local_110,"<");
        local_c8.m_result = lVar10 < local_f0;
        local_c8.m_isBinaryExpression = true;
        local_c8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_0031a338;
        local_b8 = &local_88;
        local_b0 = local_110.file;
        sStack_a8 = local_110.line;
        local_a0 = &local_d8;
        Catch::AssertionHandler::handleExpr(&local_78,&local_c8);
        Catch::ITransientExpression::~ITransientExpression(&local_c8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar3);
  }
  if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (longdouble *)0x0) {
    operator_delete(local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}